

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SOIL.c
# Opt level: O0

int SOIL_save_image(char *filename,int image_type,int width,int height,int channels,uchar *data)

{
  int local_34;
  int save_result;
  uchar *data_local;
  int channels_local;
  int height_local;
  int width_local;
  int image_type_local;
  char *filename_local;
  
  if ((((width < 1) || (height < 1)) || (channels < 1)) ||
     (((4 < channels || (data == (uchar *)0x0)) || (filename == (char *)0x0)))) {
    filename_local._4_4_ = 0;
  }
  else {
    if (image_type == 1) {
      local_34 = stbi_write_bmp(filename,width,height,channels,data);
    }
    else if (image_type == 0) {
      local_34 = stbi_write_tga(filename,width,height,channels,data);
    }
    else if (image_type == 2) {
      local_34 = save_image_as_DDS(filename,width,height,channels,data);
    }
    else {
      local_34 = 0;
    }
    if (local_34 == 0) {
      result_string_pointer = "Saving the image failed";
    }
    else {
      result_string_pointer = "Image saved";
    }
    filename_local._4_4_ = local_34;
  }
  return filename_local._4_4_;
}

Assistant:

int
	SOIL_save_image
	(
		const char *filename,
		int image_type,
		int width, int height, int channels,
		const unsigned char *const data
	)
{
	int save_result;

	/*	error check	*/
	if( (width < 1) || (height < 1) ||
		(channels < 1) || (channels > 4) ||
		(data == NULL) ||
		(filename == NULL) )
	{
		return 0;
	}
	if( image_type == SOIL_SAVE_TYPE_BMP )
	{
		save_result = stbi_write_bmp( filename,
				width, height, channels, (void*)data );
	} else
	if( image_type == SOIL_SAVE_TYPE_TGA )
	{
		save_result = stbi_write_tga( filename,
				width, height, channels, (void*)data );
	} else
	if( image_type == SOIL_SAVE_TYPE_DDS )
	{
		save_result = save_image_as_DDS( filename,
				width, height, channels, (const unsigned char *const)data );
	} else
	{
		save_result = 0;
	}
	if( save_result == 0 )
	{
		result_string_pointer = "Saving the image failed";
	} else
	{
		result_string_pointer = "Image saved";
	}
	return save_result;
}